

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrRasterizer.cpp
# Opt level: O2

bool rr::LineRasterUtil::lineInCornerAngleRange
               (SubpixelLineSegment *line,Vector<long,_2> *cornerExitNormal)

{
  bool bVar1;
  long lVar2;
  Vector<long,_2> v;
  long local_20;
  long local_18;
  
  SubpixelLineSegment::direction((SubpixelLineSegment *)&local_20);
  lVar2 = tcu::dot<long,2>((Vector<long,_2> *)&local_20,cornerExitNormal);
  if (lVar2 < 0) {
    bVar1 = false;
  }
  else {
    bVar1 = (cornerExitNormal->m_data[0] * cornerExitNormal->m_data[0] +
            cornerExitNormal->m_data[1] * cornerExitNormal->m_data[1]) *
            (local_20 * local_20 + local_18 * local_18) < lVar2 * lVar2 * 2;
  }
  return bVar1;
}

Assistant:

bool lineInCornerAngleRange (const SubpixelLineSegment& line, const tcu::Vector<deInt64,2>& cornerExitNormal)
{
	// v0 -> v1 has angle difference to cornerExitNormal in range (-45, 45)
	const tcu::Vector<deInt64,2> v = line.direction();
	const deInt64 dotProduct = dot(v, cornerExitNormal);

	// dotProduct > |v1-v0|*|cornerExitNormal|/sqrt(2)
	if (dotProduct < 0)
		return false;
	return 2 * dotProduct * dotProduct > tcu::lengthSquared(v)*tcu::lengthSquared(cornerExitNormal);
}